

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O1

bool __thiscall TypeInfo::testUnions(TypeInfo *this)

{
  short sVar1;
  short sVar2;
  wchar16 wVar3;
  wchar16 wVar4;
  XMLCh XVar5;
  XMLCh XVar6;
  DOMElement *pDVar7;
  long *plVar8;
  long *plVar9;
  wchar16 *pwVar10;
  XMLCh *pXVar11;
  ostream *poVar12;
  char *pcVar13;
  size_t sVar14;
  long lVar15;
  short *psVar16;
  long *plVar17;
  wchar16 *pwVar18;
  XMLCh *pXVar19;
  short *psVar20;
  undefined1 uVar21;
  bool bVar22;
  XStr local_70;
  XStr local_68;
  XStr local_60;
  XStr local_58;
  XStr local_50;
  XStr local_48;
  XStr local_40;
  XStr local_38;
  
  (**(code **)(*(long *)this->doc + 0x68))();
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("unionTest",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pDVar7 = findElement(this,local_70.fUnicodeForm);
  XStr::~XStr(&local_70);
  plVar8 = (long *)(**(code **)(*(long *)pDVar7 + 0x38))(pDVar7);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
  pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimalDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar22 = true;
  if (pwVar10 != local_70.fUnicodeForm) {
    pwVar18 = local_70.fUnicodeForm;
    if (local_70.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_70.fUnicodeForm != (wchar16 *)0x0) goto LAB_001172d9;
      }
      else {
        bVar22 = *pwVar10 == L'\0';
        if ((local_70.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_001172d9:
          bVar22 = *pwVar18 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar10;
        if (wVar3 == L'\0') goto LAB_001172d9;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar18;
        pwVar18 = pwVar18 + 1;
      } while (wVar3 == wVar4);
      bVar22 = false;
    }
  }
  if (bVar22) {
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    pXVar11 = (XMLCh *)(**(code **)(*plVar9 + 0x18))(plVar9);
    local_38.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pXVar11 != local_38.fUnicodeForm) {
      pXVar19 = local_38.fUnicodeForm;
      if (local_38.fUnicodeForm == (XMLCh *)0x0 || pXVar11 == (XMLCh *)0x0) {
        if (pXVar11 == (XMLCh *)0x0) {
          if (local_38.fUnicodeForm != (XMLCh *)0x0) goto LAB_00117370;
        }
        else {
          tmp = *pXVar11 == L'\0';
          if ((local_38.fUnicodeForm != (XMLCh *)0x0) && (*pXVar11 == L'\0')) {
LAB_00117370:
            tmp = *pXVar19 == L'\0';
          }
        }
      }
      else {
        do {
          XVar5 = *pXVar11;
          if (XVar5 == L'\0') goto LAB_00117370;
          pXVar11 = pXVar11 + 1;
          XVar6 = *pXVar19;
          pXVar19 = pXVar19 + 1;
        } while (XVar5 == XVar6);
        tmp = false;
      }
    }
    if (bVar22) {
      XStr::~XStr(&local_38);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_70);
  uVar21 = tmp;
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1f1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"\nExpected values : typename \'",0x1d);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("decimalDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_70.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', uri \'",8);
    local_48.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_48.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    XStr::~XStr(&local_48);
    XStr::~XStr(&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar15 = (**(code **)(*plVar9 + 0x10))(plVar9);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_0011754a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_0011754a;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar15 = (**(code **)(*plVar9 + 0x18))(plVar9);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_001175f1:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_001175f1;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
  pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar22 = true;
  if (pwVar10 != local_70.fUnicodeForm) {
    pwVar18 = local_70.fUnicodeForm;
    if (local_70.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_70.fUnicodeForm != (wchar16 *)0x0) goto LAB_001176e4;
      }
      else {
        bVar22 = *pwVar10 == L'\0';
        if ((local_70.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_001176e4:
          bVar22 = *pwVar18 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar10;
        if (wVar3 == L'\0') goto LAB_001176e4;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar18;
        pwVar18 = pwVar18 + 1;
      } while (wVar3 == wVar4);
      bVar22 = false;
    }
  }
  if (bVar22) {
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
    local_48.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar10 != local_48.fUnicodeForm) {
      pwVar18 = local_48.fUnicodeForm;
      if (local_48.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
        if (pwVar10 == (wchar16 *)0x0) {
          if (local_48.fUnicodeForm != (wchar16 *)0x0) goto LAB_0011777d;
        }
        else {
          tmp = *pwVar10 == L'\0';
          if ((local_48.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_0011777d:
            tmp = *pwVar18 == L'\0';
          }
        }
      }
      else {
        do {
          wVar3 = *pwVar10;
          if (wVar3 == L'\0') goto LAB_0011777d;
          pwVar10 = pwVar10 + 1;
          wVar4 = *pwVar18;
          pwVar18 = pwVar18 + 1;
        } while (wVar3 == wVar4);
        tmp = false;
      }
    }
    if (bVar22) {
      XStr::~XStr(&local_48);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_70);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,500);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"\nExpected values : typename \'",0x1d);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_70.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', uri \'",8);
    local_50.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_50.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    XStr::~XStr(&local_50);
    XStr::~XStr(&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar15 = (**(code **)(*plVar9 + 0x10))(plVar9);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_00117954:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_00117954;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar15 = (**(code **)(*plVar9 + 0x18))(plVar9);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_001179fa:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_001179fa;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
  pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_70.fUnicodeForm) {
LAB_00117af2:
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    psVar16 = (short *)(**(code **)(*plVar9 + 0x18))(plVar9);
    if (psVar16 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
    }
    else {
      psVar20 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar16 != (short *)0x0) {
        do {
          sVar1 = *psVar16;
          if (sVar1 == 0) goto LAB_00117b38;
          psVar16 = psVar16 + 1;
          sVar2 = *psVar20;
          psVar20 = psVar20 + 1;
        } while (sVar1 == sVar2);
        goto LAB_00117b34;
      }
LAB_00117b38:
      tmp = *psVar20 == 0;
    }
  }
  else {
    pwVar18 = local_70.fUnicodeForm;
    if (local_70.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_70.fUnicodeForm == (wchar16 *)0x0) goto LAB_00117af2;
LAB_00117ae7:
        bVar22 = *pwVar18 == L'\0';
      }
      else {
        bVar22 = *pwVar10 == L'\0';
        if ((local_70.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) goto LAB_00117ae7;
      }
      if (bVar22) goto LAB_00117af2;
    }
    else {
      do {
        wVar3 = *pwVar10;
        if (wVar3 == L'\0') goto LAB_00117ae7;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar18;
        pwVar18 = pwVar18 + 1;
      } while (wVar3 == wVar4);
    }
LAB_00117b34:
    tmp = false;
  }
  XStr::~XStr(&local_70);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1f7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"\nExpected values : typename \'",0x1d);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_70.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', uri \'",8);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    XStr::~XStr(&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar15 = (**(code **)(*plVar9 + 0x10))(plVar9);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_00117ce6:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_00117ce6;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar15 = (**(code **)(*plVar9 + 0x18))(plVar9);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_00117d8c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_00117d8c;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
  pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_70.fUnicodeForm) {
LAB_00117e84:
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    psVar16 = (short *)(**(code **)(*plVar9 + 0x18))(plVar9);
    if (psVar16 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
    }
    else {
      psVar20 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar16 != (short *)0x0) {
        do {
          sVar1 = *psVar16;
          if (sVar1 == 0) goto LAB_00117eca;
          psVar16 = psVar16 + 1;
          sVar2 = *psVar20;
          psVar20 = psVar20 + 1;
        } while (sVar1 == sVar2);
        goto LAB_00117ec6;
      }
LAB_00117eca:
      tmp = *psVar20 == 0;
    }
  }
  else {
    pwVar18 = local_70.fUnicodeForm;
    if (local_70.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_70.fUnicodeForm == (wchar16 *)0x0) goto LAB_00117e84;
LAB_00117e79:
        bVar22 = *pwVar18 == L'\0';
      }
      else {
        bVar22 = *pwVar10 == L'\0';
        if ((local_70.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) goto LAB_00117e79;
      }
      if (bVar22) goto LAB_00117e84;
    }
    else {
      do {
        wVar3 = *pwVar10;
        if (wVar3 == L'\0') goto LAB_00117e79;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar18;
        pwVar18 = pwVar18 + 1;
      } while (wVar3 == wVar4);
    }
LAB_00117ec6:
    tmp = false;
  }
  XStr::~XStr(&local_70);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1fa);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"\nExpected values : typename \'",0x1d);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_70.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', uri \'",8);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    XStr::~XStr(&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar15 = (**(code **)(*plVar9 + 0x10))(plVar9);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_00118078:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_00118078;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
    lVar15 = (**(code **)(*plVar9 + 0x18))(plVar9);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_0011811e:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar8 + 0x1d8))(plVar8);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_0011811e;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_70.fUnicodeForm);
  XStr::~XStr(&local_70);
  plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimalDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar22 = true;
  if (pwVar10 != local_70.fUnicodeForm) {
    pwVar18 = local_70.fUnicodeForm;
    if (local_70.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_70.fUnicodeForm != (wchar16 *)0x0) goto LAB_00118249;
      }
      else {
        bVar22 = *pwVar10 == L'\0';
        if ((local_70.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_00118249:
          bVar22 = *pwVar18 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar10;
        if (wVar3 == L'\0') goto LAB_00118249;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar18;
        pwVar18 = pwVar18 + 1;
      } while (wVar3 == wVar4);
      bVar22 = false;
    }
  }
  if (bVar22) {
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x18))(plVar17);
    local_50.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar10 != local_50.fUnicodeForm) {
      pwVar18 = local_50.fUnicodeForm;
      if (local_50.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
        if (pwVar10 == (wchar16 *)0x0) {
          if (local_50.fUnicodeForm != (wchar16 *)0x0) goto LAB_001182e8;
        }
        else {
          tmp = *pwVar10 == L'\0';
          if ((local_50.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_001182e8:
            tmp = *pwVar18 == L'\0';
          }
        }
      }
      else {
        do {
          wVar3 = *pwVar10;
          if (wVar3 == L'\0') goto LAB_001182e8;
          pwVar10 = pwVar10 + 1;
          wVar4 = *pwVar18;
          pwVar18 = pwVar18 + 1;
        } while (wVar3 == wVar4);
        tmp = false;
      }
    }
    if (bVar22) {
      XStr::~XStr(&local_50);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_70);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1fe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"\nExpected values : typename \'",0x1d);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("decimalDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_70.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', uri \'",8);
    local_58.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_58.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    XStr::~XStr(&local_58);
    XStr::~XStr(&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_001184bf:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_001184bf;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_00118565:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_00118565;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr2",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_70.fUnicodeForm);
  XStr::~XStr(&local_70);
  plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar22 = true;
  if (pwVar10 != local_70.fUnicodeForm) {
    pwVar18 = local_70.fUnicodeForm;
    if (local_70.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_70.fUnicodeForm != (wchar16 *)0x0) goto LAB_0011867b;
      }
      else {
        bVar22 = *pwVar10 == L'\0';
        if ((local_70.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_0011867b:
          bVar22 = *pwVar18 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar10;
        if (wVar3 == L'\0') goto LAB_0011867b;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar18;
        pwVar18 = pwVar18 + 1;
      } while (wVar3 == wVar4);
      bVar22 = false;
    }
  }
  if (bVar22) {
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x18))(plVar17);
    local_58.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar10 != local_58.fUnicodeForm) {
      pwVar18 = local_58.fUnicodeForm;
      if (local_58.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
        if (pwVar10 == (wchar16 *)0x0) {
          if (local_58.fUnicodeForm != (wchar16 *)0x0) goto LAB_0011871a;
        }
        else {
          tmp = *pwVar10 == L'\0';
          if ((local_58.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_0011871a:
            tmp = *pwVar18 == L'\0';
          }
        }
      }
      else {
        do {
          wVar3 = *pwVar10;
          if (wVar3 == L'\0') goto LAB_0011871a;
          pwVar10 = pwVar10 + 1;
          wVar4 = *pwVar18;
          pwVar18 = pwVar18 + 1;
        } while (wVar3 == wVar4);
        tmp = false;
      }
    }
    if (bVar22) {
      XStr::~XStr(&local_58);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_70);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x200);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"\nExpected values : typename \'",0x1d);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_70.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', uri \'",8);
    local_60.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_60.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    XStr::~XStr(&local_60);
    XStr::~XStr(&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_001188f1:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_001188f1;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_00118997:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_00118997;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_70.fUnicodeForm);
  XStr::~XStr(&local_70);
  plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar22 = true;
  if (pwVar10 != local_70.fUnicodeForm) {
    pwVar18 = local_70.fUnicodeForm;
    if (local_70.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_70.fUnicodeForm != (wchar16 *)0x0) goto LAB_00118ac2;
      }
      else {
        bVar22 = *pwVar10 == L'\0';
        if ((local_70.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_00118ac2:
          bVar22 = *pwVar18 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar10;
        if (wVar3 == L'\0') goto LAB_00118ac2;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar18;
        pwVar18 = pwVar18 + 1;
      } while (wVar3 == wVar4);
      bVar22 = false;
    }
  }
  if (bVar22) {
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x18))(plVar17);
    local_60.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar10 != local_60.fUnicodeForm) {
      pwVar18 = local_60.fUnicodeForm;
      if (local_60.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
        if (pwVar10 == (wchar16 *)0x0) {
          if (local_60.fUnicodeForm != (wchar16 *)0x0) goto LAB_00118b61;
        }
        else {
          tmp = *pwVar10 == L'\0';
          if ((local_60.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_00118b61:
            tmp = *pwVar18 == L'\0';
          }
        }
      }
      else {
        do {
          wVar3 = *pwVar10;
          if (wVar3 == L'\0') goto LAB_00118b61;
          pwVar10 = pwVar10 + 1;
          wVar4 = *pwVar18;
          pwVar18 = pwVar18 + 1;
        } while (wVar3 == wVar4);
        tmp = false;
      }
    }
    if (bVar22) {
      XStr::~XStr(&local_60);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_70);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x204);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"\nExpected values : typename \'",0x1d);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("stringDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_70.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', uri \'",8);
    local_68.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_68.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    XStr::~XStr(&local_68);
    XStr::~XStr(&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_00118d38:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_00118d38;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_00118dde:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_00118dde;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr2",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_70.fUnicodeForm);
  XStr::~XStr(&local_70);
  plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimalDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar22 = true;
  if (pwVar10 != local_70.fUnicodeForm) {
    pwVar18 = local_70.fUnicodeForm;
    if (local_70.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_70.fUnicodeForm != (wchar16 *)0x0) goto LAB_00118ef4;
      }
      else {
        bVar22 = *pwVar10 == L'\0';
        if ((local_70.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_00118ef4:
          bVar22 = *pwVar18 == L'\0';
        }
      }
    }
    else {
      do {
        wVar3 = *pwVar10;
        if (wVar3 == L'\0') goto LAB_00118ef4;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar18;
        pwVar18 = pwVar18 + 1;
      } while (wVar3 == wVar4);
      bVar22 = false;
    }
  }
  if (bVar22) {
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x18))(plVar17);
    local_68.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    tmp = true;
    if (pwVar10 != local_68.fUnicodeForm) {
      pwVar18 = local_68.fUnicodeForm;
      if (local_68.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
        if (pwVar10 == (wchar16 *)0x0) {
          if (local_68.fUnicodeForm != (wchar16 *)0x0) goto LAB_00118f93;
        }
        else {
          tmp = *pwVar10 == L'\0';
          if ((local_68.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) {
LAB_00118f93:
            tmp = *pwVar18 == L'\0';
          }
        }
      }
      else {
        do {
          wVar3 = *pwVar10;
          if (wVar3 == L'\0') goto LAB_00118f93;
          pwVar10 = pwVar10 + 1;
          wVar4 = *pwVar18;
          pwVar18 = pwVar18 + 1;
        } while (wVar3 == wVar4);
        tmp = false;
      }
    }
    if (bVar22) {
      XStr::~XStr(&local_68);
    }
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_70);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x206);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"\nExpected values : typename \'",0x1d);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("decimalDerivedType",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_70.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', uri \'",8);
    local_40.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_40.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    XStr::~XStr(&local_40);
    XStr::~XStr(&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_0011916a:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_0011916a;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_00119210:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_00119210;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_70.fUnicodeForm);
  XStr::~XStr(&local_70);
  plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_70.fUnicodeForm) {
LAB_0011933f:
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    psVar16 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar16 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
    }
    else {
      psVar20 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar16 != (short *)0x0) {
        do {
          sVar1 = *psVar16;
          if (sVar1 == 0) goto LAB_00119385;
          psVar16 = psVar16 + 1;
          sVar2 = *psVar20;
          psVar20 = psVar20 + 1;
        } while (sVar1 == sVar2);
        goto LAB_00119381;
      }
LAB_00119385:
      tmp = *psVar20 == 0;
    }
  }
  else {
    pwVar18 = local_70.fUnicodeForm;
    if (local_70.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_70.fUnicodeForm == (wchar16 *)0x0) goto LAB_0011933f;
LAB_00119334:
        bVar22 = *pwVar18 == L'\0';
      }
      else {
        bVar22 = *pwVar10 == L'\0';
        if ((local_70.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) goto LAB_00119334;
      }
      if (bVar22) goto LAB_0011933f;
    }
    else {
      do {
        wVar3 = *pwVar10;
        if (wVar3 == L'\0') goto LAB_00119334;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar18;
        pwVar18 = pwVar18 + 1;
      } while (wVar3 == wVar4);
    }
LAB_00119381:
    tmp = false;
  }
  XStr::~XStr(&local_70);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x20a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"\nExpected values : typename \'",0x1d);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_70.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', uri \'",8);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    XStr::~XStr(&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_00119533:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_00119533;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_001195d9:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_001195d9;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr2",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_70.fUnicodeForm);
  XStr::~XStr(&local_70);
  plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_70.fUnicodeForm) {
LAB_001196f3:
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    psVar16 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar16 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
    }
    else {
      psVar20 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar16 != (short *)0x0) {
        do {
          sVar1 = *psVar16;
          if (sVar1 == 0) goto LAB_00119739;
          psVar16 = psVar16 + 1;
          sVar2 = *psVar20;
          psVar20 = psVar20 + 1;
        } while (sVar1 == sVar2);
        goto LAB_00119735;
      }
LAB_00119739:
      tmp = *psVar20 == 0;
    }
  }
  else {
    pwVar18 = local_70.fUnicodeForm;
    if (local_70.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_70.fUnicodeForm == (wchar16 *)0x0) goto LAB_001196f3;
LAB_001196e8:
        bVar22 = *pwVar18 == L'\0';
      }
      else {
        bVar22 = *pwVar10 == L'\0';
        if ((local_70.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) goto LAB_001196e8;
      }
      if (bVar22) goto LAB_001196f3;
    }
    else {
      do {
        wVar3 = *pwVar10;
        if (wVar3 == L'\0') goto LAB_001196e8;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar18;
        pwVar18 = pwVar18 + 1;
      } while (wVar3 == wVar4);
    }
LAB_00119735:
    tmp = false;
  }
  XStr::~XStr(&local_70);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x20c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"\nExpected values : typename \'",0x1d);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_70.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', uri \'",8);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    XStr::~XStr(&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_001198e7:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_001198e7;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_0011998d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_0011998d;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x50))(plVar8);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_70.fUnicodeForm);
  XStr::~XStr(&local_70);
  plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
  pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pwVar10 == local_70.fUnicodeForm) {
LAB_00119abc:
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    psVar16 = (short *)(**(code **)(*plVar17 + 0x18))(plVar17);
    if (psVar16 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
    }
    else {
      psVar20 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar16 != (short *)0x0) {
        do {
          sVar1 = *psVar16;
          if (sVar1 == 0) goto LAB_00119b02;
          psVar16 = psVar16 + 1;
          sVar2 = *psVar20;
          psVar20 = psVar20 + 1;
        } while (sVar1 == sVar2);
        goto LAB_00119afe;
      }
LAB_00119b02:
      tmp = *psVar20 == 0;
    }
  }
  else {
    pwVar18 = local_70.fUnicodeForm;
    if (local_70.fUnicodeForm == (wchar16 *)0x0 || pwVar10 == (wchar16 *)0x0) {
      if (pwVar10 == (wchar16 *)0x0) {
        if (local_70.fUnicodeForm == (wchar16 *)0x0) goto LAB_00119abc;
LAB_00119ab1:
        bVar22 = *pwVar18 == L'\0';
      }
      else {
        bVar22 = *pwVar10 == L'\0';
        if ((local_70.fUnicodeForm != (wchar16 *)0x0) && (*pwVar10 == L'\0')) goto LAB_00119ab1;
      }
      if (bVar22) goto LAB_00119abc;
    }
    else {
      do {
        wVar3 = *pwVar10;
        if (wVar3 == L'\0') goto LAB_00119ab1;
        pwVar10 = pwVar10 + 1;
        wVar4 = *pwVar18;
        pwVar18 = pwVar18 + 1;
      } while (wVar3 == wVar4);
    }
LAB_00119afe:
    tmp = false;
  }
  XStr::~XStr(&local_70);
  if (tmp == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x210);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"\nExpected values : typename \'",0x1d);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ("string",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (local_70.fUnicodeForm,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', uri \'",8);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar14 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
    }
    XStr::~XStr(&local_70);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x10))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_00119cb0:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_00119cb0;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
    plVar17 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
    lVar15 = (**(code **)(*plVar17 + 0x18))(plVar17);
    if (lVar15 == 0) {
      pcVar13 = "(null)";
      sVar14 = 6;
LAB_00119d56:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0x170))(plVar9);
      pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x18))(plVar9);
      pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (pcVar13 != (char *)0x0) {
        sVar14 = strlen(pcVar13);
        goto LAB_00119d56;
      }
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    uVar21 = 0;
  }
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("testAttr2",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar8 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8,0,local_70.fUnicodeForm);
  XStr::~XStr(&local_70);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  pXVar11 = (XMLCh *)(**(code **)(*plVar9 + 0x10))(plVar9);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pXVar11 == local_70.fUnicodeForm) {
LAB_00119e6e:
    plVar9 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    psVar16 = (short *)(**(code **)(*plVar9 + 0x18))(plVar9);
    if (psVar16 == (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      tmp = true;
    }
    else {
      psVar20 = (short *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA;
      if (psVar16 != (short *)0x0) {
        do {
          sVar1 = *psVar16;
          if (sVar1 == 0) goto LAB_00119eb4;
          psVar16 = psVar16 + 1;
          sVar2 = *psVar20;
          psVar20 = psVar20 + 1;
        } while (sVar1 == sVar2);
        goto LAB_00119eb0;
      }
LAB_00119eb4:
      tmp = *psVar20 == 0;
    }
  }
  else {
    pXVar19 = local_70.fUnicodeForm;
    if (local_70.fUnicodeForm == (XMLCh *)0x0 || pXVar11 == (XMLCh *)0x0) {
      if (pXVar11 == (XMLCh *)0x0) {
        if (local_70.fUnicodeForm == (XMLCh *)0x0) goto LAB_00119e6e;
LAB_00119e63:
        bVar22 = *pXVar19 == L'\0';
      }
      else {
        bVar22 = *pXVar11 == L'\0';
        if ((local_70.fUnicodeForm != (XMLCh *)0x0) && (*pXVar11 == L'\0')) goto LAB_00119e63;
      }
      if (bVar22) goto LAB_00119e6e;
    }
    else {
      do {
        XVar5 = *pXVar11;
        if (XVar5 == L'\0') goto LAB_00119e63;
        pXVar11 = pXVar11 + 1;
        XVar6 = *pXVar19;
        pXVar19 = pXVar19 + 1;
      } while (XVar5 == XVar6);
    }
LAB_00119eb0:
    tmp = false;
  }
  XStr::~XStr(&local_70);
  if (tmp != false) {
    return (bool)uVar21;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ",0x21);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x212);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\nExpected values : typename \'",0x1d)
  ;
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("decimal",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                              (local_70.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
  ;
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
  }
  else {
    sVar14 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', uri \'",8);
  pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                              ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                               xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
  }
  else {
    sVar14 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar13,sVar14);
  }
  XStr::~XStr(&local_70);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\'\nActual values   : typename \'",0x1e);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  lVar15 = (**(code **)(*plVar9 + 0x10))(plVar9);
  if (lVar15 == 0) {
    pcVar13 = "(null)";
    sVar14 = 6;
LAB_0011a062:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
  }
  else {
    plVar9 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    pwVar10 = (wchar16 *)(**(code **)(*plVar9 + 0x10))(plVar9);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 != (char *)0x0) {
      sVar14 = strlen(pcVar13);
      goto LAB_0011a062;
    }
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\', uri \'",8);
  plVar9 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
  lVar15 = (**(code **)(*plVar9 + 0x18))(plVar9);
  if (lVar15 == 0) {
    pcVar13 = "(null)";
    sVar14 = 6;
  }
  else {
    plVar8 = (long *)(**(code **)(*plVar8 + 0x170))(plVar8);
    pwVar10 = (wchar16 *)(**(code **)(*plVar8 + 0x18))(plVar8);
    pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12f240);
      goto LAB_0011a126;
    }
    sVar14 = strlen(pcVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar14);
LAB_0011a126:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return false;
}

Assistant:

bool TypeInfo::testUnions() {

    bool passed = true;
    DOMNode *docEle = doc->getDocumentElement();
    UNUSED(docEle); // silence warning
    DOMAttr *testAttr;

    //element unionTest
    DOMElement *testEle = findElement(X("unionTest"));

    testEle = (DOMElement *)testEle->getFirstChild()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("decimalDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("decimal"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("string"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimalDerivedType"), X(""), __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimalDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimal"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("string"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("string"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimal"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    return passed;

}